

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ConvertComplexPass.h
# Opt level: O0

Expression * __thiscall
soul::ConvertComplexPass::ConvertComplexRemapTypes::getRemappedType
          (ConvertComplexRemapTypes *this,Context *context,bool is32Bit,size_t vectorSize,
          size_t arraySize,bool isReference,bool isConst)

{
  ConcreteType *pCVar1;
  Type local_a8;
  Type local_90;
  Type local_68;
  undefined1 local_50 [8];
  Type complexType;
  bool isConst_local;
  bool isReference_local;
  size_t arraySize_local;
  size_t vectorSize_local;
  bool is32Bit_local;
  Context *context_local;
  ConvertComplexRemapTypes *this_local;
  
  complexType.structure.object._6_1_ = isConst;
  complexType.structure.object._7_1_ = isReference;
  getComplexType((Type *)local_50,this,context,is32Bit,vectorSize);
  if (arraySize != 0) {
    Type::createArray(&local_68,(Type *)local_50,arraySize);
    Type::operator=((Type *)local_50,&local_68);
    Type::~Type(&local_68);
  }
  if ((complexType.structure.object._7_1_ & 1) != 0) {
    Type::createReference(&local_90,(Type *)local_50);
    Type::operator=((Type *)local_50,&local_90);
    Type::~Type(&local_90);
  }
  if ((complexType.structure.object._6_1_ & 1) != 0) {
    Type::createConst(&local_a8,(Type *)local_50);
    Type::operator=((Type *)local_50,&local_a8);
    Type::~Type(&local_a8);
  }
  pCVar1 = AST::Allocator::allocate<soul::AST::ConcreteType,soul::AST::Context&,soul::Type&>
                     (this->allocator,context,(Type *)local_50);
  Type::~Type((Type *)local_50);
  return &pCVar1->super_Expression;
}

Assistant:

AST::Expression& getRemappedType (AST::Context& context, bool is32Bit, size_t vectorSize, size_t arraySize, bool isReference, bool isConst)
        {
            auto complexType = getComplexType (context, is32Bit, vectorSize);

            if (arraySize != 0)
                complexType = complexType.createArray (arraySize);

            if (isReference)
                complexType = complexType.createReference();

            if (isConst)
                complexType = complexType.createConst();

            return allocator.allocate<AST::ConcreteType> (context, complexType);
        }